

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamWriter::QXmlStreamWriter(QXmlStreamWriter *this)

{
  unique_ptr<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_> *this_00;
  pointer in_RDI;
  QXmlStreamWriter *in_stack_00000008;
  QXmlStreamWriterPrivate *in_stack_00000010;
  
  this_00 = (unique_ptr<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_> *)
            operator_new(0xe0);
  QXmlStreamWriterPrivate::QXmlStreamWriterPrivate(in_stack_00000010,in_stack_00000008);
  std::unique_ptr<QXmlStreamWriterPrivate,std::default_delete<QXmlStreamWriterPrivate>>::
  unique_ptr<std::default_delete<QXmlStreamWriterPrivate>,void>(this_00,in_RDI);
  return;
}

Assistant:

QXmlStreamWriter::QXmlStreamWriter()
    : d_ptr(new QXmlStreamWriterPrivate(this))
{
}